

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition>::erase
          (QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition> *this,FilterCondition *b,
          qsizetype n)

{
  FilterCondition *pFVar1;
  long in_RDX;
  FilterCondition *in_RSI;
  long in_RDI;
  FilterCondition *end;
  FilterCondition *e;
  FilterCondition *in_stack_ffffffffffffffb8;
  FilterCondition *in_stack_ffffffffffffffc0;
  FilterCondition *local_20;
  
  local_20 = in_RSI + in_RDX;
  pFVar1 = QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::begin
                     ((QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)0x11c816);
  if ((in_RSI == pFVar1) &&
     (in_stack_ffffffffffffffc0 = local_20,
     pFVar1 = QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::end
                        ((QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)local_20
                        ), in_stack_ffffffffffffffc0 != pFVar1)) {
    *(FilterCondition **)(in_RDI + 8) = local_20;
  }
  else {
    pFVar1 = QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::end
                       ((QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                        in_stack_ffffffffffffffc0);
    for (; local_20 != pFVar1; local_20 = local_20 + 1) {
      QXdgDesktopPortalFileDialog::FilterCondition::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  std::destroy<QXdgDesktopPortalFileDialog::FilterCondition*>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }